

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DOMLSSerializerImpl::isNamespaceBindingActive
          (DOMLSSerializerImpl *this,XMLCh *prefix,XMLCh *uri)

{
  XMLCh XVar1;
  char16_t cVar2;
  XMLCh *pXVar3;
  bool bVar4;
  RefHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pRVar5;
  ulong uVar6;
  char16_t *pcVar7;
  char16_t *pcVar8;
  RefHashTableBucketElem<char16_t> *pRVar9;
  XMLSize_t getAt;
  
  getAt = (this->fNamespaceStack->
          super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>).
          fCurCount;
  if (getAt != 0) {
    do {
      getAt = getAt - 1;
      pRVar5 = BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>::
               elementAt(&this->fNamespaceStack->
                          super_BaseRefVectorOf<xercesc_4_0::RefHashTableOf<char16_t,_xercesc_4_0::StringHasher>_>
                         ,getAt);
      if ((prefix == (XMLCh *)0x0) || (uVar6 = (ulong)(ushort)*prefix, uVar6 == 0)) {
        uVar6 = 0;
      }
      else {
        XVar1 = prefix[1];
        pXVar3 = prefix + 2;
        while (XVar1 != L'\0') {
          uVar6 = (ulong)(ushort)XVar1 + (uVar6 >> 0x18) + uVar6 * 0x26;
          XVar1 = *pXVar3;
          pXVar3 = pXVar3 + 1;
        }
        uVar6 = uVar6 % pRVar5->fHashModulus;
      }
      pRVar9 = pRVar5->fBucketList[uVar6];
      if (pRVar9 != (RefHashTableBucketElem<char16_t> *)0x0) {
        do {
          bVar4 = StringHasher::equals((StringHasher *)&pRVar5->field_0x30,prefix,pRVar9->fKey);
          if (bVar4) {
            pcVar8 = pRVar9->fData;
            if (pcVar8 != (char16_t *)0x0) {
              if (pcVar8 == uri) {
                return true;
              }
              pcVar7 = pcVar8;
              if (uri != (XMLCh *)0x0) {
                while (pcVar8 = uri, cVar2 = *pcVar7, cVar2 != L'\0') {
                  pcVar7 = pcVar7 + 1;
                  uri = pcVar8 + 1;
                  if (cVar2 != *pcVar8) {
                    return false;
                  }
                }
              }
              return *pcVar8 == L'\0';
            }
            break;
          }
          pRVar9 = pRVar9->fNext;
        } while (pRVar9 != (RefHashTableBucketElem<char16_t> *)0x0);
      }
    } while (getAt != 0);
  }
  return false;
}

Assistant:

bool DOMLSSerializerImpl::isNamespaceBindingActive(const XMLCh* prefix, const XMLCh* uri) const
{
    for(XMLSize_t i=fNamespaceStack->size();i>0;i--)
    {
        RefHashTableOf<XMLCh>* curNamespaceMap=fNamespaceStack->elementAt(i-1);
        const XMLCh* thisUri=curNamespaceMap->get((void*)prefix);
        // if the prefix has been declared, check if it binds to the correct namespace, otherwise, reports it isn't bound
        if(thisUri)
            return XMLString::equals(thisUri,uri);
    }
    return false;
}